

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

void __thiscall embree::Variant::Variant(Variant *this,shared_ptr<embree::Texture> *tex)

{
  this->type = TEXTURE;
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->texture).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>,
             &tex->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Variant (const std::shared_ptr<Texture> tex) : type(TEXTURE), texture(tex) {}